

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::DeserializeDecimalArithmetic<duckdb::AddOperator,duckdb::DecimalAddOverflowCheck,false>
          (duckdb *this,Deserializer *deserializer,ScalarFunction *bound_function)

{
  int iVar1;
  pointer pDVar2;
  LogicalType return_type;
  vector<duckdb::LogicalType,_true> arguments;
  LogicalType local_78;
  _Any_data local_60;
  code *local_50;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_40;
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,100,"check_overflow");
  iVar1 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x65,"return_type");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  LogicalType::Deserialize(&local_78,deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  Deserializer::ReadProperty<duckdb::vector<duckdb::LogicalType,true>>
            ((vector<duckdb::LogicalType,_true> *)&local_40,deserializer,0x66,"arguments");
  if (SUB41(iVar1,0) == false) {
    GetScalarBinaryFunction<duckdb::AddOperator>
              ((scalar_function_t *)&local_60,local_78.physical_type_);
    ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
    operator=(&bound_function->function,
              (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
              &local_60);
    if (local_50 != (code *)0x0) {
      (*local_50)(&local_60,&local_60,__destroy_functor);
    }
  }
  else {
    GetScalarBinaryFunction<duckdb::DecimalAddOverflowCheck>
              ((scalar_function_t *)&local_60,local_78.physical_type_);
    ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
    operator=(&bound_function->function,
              (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
              &local_60);
    if (local_50 != (code *)0x0) {
      (*local_50)(&local_60,&local_60,__destroy_functor);
    }
  }
  bound_function->statistics = (function_statistics_t)0x0;
  if (&(bound_function->super_BaseScalarFunction).return_type != &local_78) {
    (bound_function->super_BaseScalarFunction).return_type.id_ = local_78.id_;
    (bound_function->super_BaseScalarFunction).return_type.physical_type_ = local_78.physical_type_;
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              (&(bound_function->super_BaseScalarFunction).return_type.type_info_,
               &local_78.type_info_);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
             &(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments,&local_40);
  local_60._M_unused._M_object = operator_new(0x10);
  *(undefined ***)local_60._M_unused._0_8_ = &PTR__FunctionData_02458f70;
  *(undefined1 *)((long)local_60._M_unused._0_8_ + 8) = 0;
  pDVar2 = unique_ptr<duckdb::DecimalArithmeticBindData,_std::default_delete<duckdb::DecimalArithmeticBindData>,_true>
           ::operator->((unique_ptr<duckdb::DecimalArithmeticBindData,_std::default_delete<duckdb::DecimalArithmeticBindData>,_true>
                         *)&local_60);
  pDVar2->check_overflow = SUB41(iVar1,0);
  *(void **)this = local_60._M_unused._M_object;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_40);
  LogicalType::~LogicalType(&local_78);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> DeserializeDecimalArithmetic(Deserializer &deserializer, ScalarFunction &bound_function) {

	//	// re-change the function pointers
	auto check_overflow = deserializer.ReadProperty<bool>(100, "check_overflow");
	auto return_type = deserializer.ReadProperty<LogicalType>(101, "return_type");
	auto arguments = deserializer.ReadProperty<vector<LogicalType>>(102, "arguments");
	if (check_overflow) {
		bound_function.function = GetScalarBinaryFunction<OPOVERFLOWCHECK>(return_type.InternalType());
	} else {
		bound_function.function = GetScalarBinaryFunction<OP>(return_type.InternalType());
	}
	bound_function.statistics = nullptr; // TODO we likely dont want to do stats prop again
	bound_function.return_type = return_type;
	bound_function.arguments = arguments;

	auto bind_data = make_uniq<DecimalArithmeticBindData>();
	bind_data->check_overflow = check_overflow;
	return std::move(bind_data);
}